

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O2

void __thiscall DetectorSS::Merge(DetectorSS *this,DetectorSS *detector)

{
  int len;
  uchar **ppuVar1;
  key_tp **ppkVar2;
  int **ppiVar3;
  int *piVar4;
  int *piVar5;
  int j;
  long lVar6;
  DetectorSS *this_00;
  int i;
  long lVar7;
  
  ppuVar1 = (detector->ss_).counts;
  ppkVar2 = (detector->ss_).skey;
  ppiVar3 = (detector->ss_).level;
  this_00 = this;
  for (lVar7 = 0; lVar7 < (this->ss_).depth; lVar7 = lVar7 + 1) {
    for (lVar6 = 0; lVar6 < (this->ss_).width; lVar6 = lVar6 + 1) {
      len = (this->ss_).offsets[(this->ss_).c];
      Mergebmp(this_00,(this->ss_).counts[lVar7],ppuVar1[lVar7],(int)lVar6 * len,len);
      piVar4 = (this->ss_).level[lVar7];
      piVar5 = ppiVar3[lVar7];
      if (piVar4[lVar6] <= piVar5[lVar6]) {
        (this->ss_).skey[lVar7][lVar6] = ppkVar2[lVar7][lVar6];
        piVar4[lVar6] = piVar5[lVar6];
      }
    }
  }
  return;
}

Assistant:

void DetectorSS::Merge(DetectorSS* detector) {
	DetectorSS* ss = (DetectorSS*)detector;
	unsigned char** counts = ss->GetTable();
	key_tp** skey = ss->GetKey();
	int** level = ss->GetLevel();
	for (int i = 0; i < ss_.depth; i++) {
		for (int j = 0; j < ss_.width; j++) {
			Mergebmp(ss_.counts[i], counts[i], j * ss_.offsets[ss_.c], ss_.offsets[ss_.c]);
			if (ss_.level[i][j] <= level[i][j]) {
				ss_.skey[i][j] = skey[i][j];
				ss_.level[i][j] = level[i][j];
			}
		}
	}
}